

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.cpp
# Opt level: O2

string * de::toUpper(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  locale *__loc;
  size_type sVar3;
  char local_49;
  string *local_48;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  local_48 = __return_storage_ptr__;
  __loc = (locale *)std::locale::classic();
  local_40.container = __return_storage_ptr__;
  local_40.iter._M_current = (char *)&__return_storage_ptr__->field_2;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    local_49 = std::toupper<char>(pcVar1[sVar3],__loc);
    std::
    insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_40,&local_49);
  }
  return local_48;
}

Assistant:

string toUpper (const string& str)
{
	string ret;
	std::transform(str.begin(), str.end(), std::inserter(ret, ret.begin()), ToUpper());
	return ret;
}